

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::CrcDivision
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *genPoly,U32 crcNumber)

{
  value_type vVar1;
  bool bVar2;
  reference pvVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  size_type __n;
  uchar local_81;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  vector<BitState,_std::allocator<BitState>_> dataBits;
  U64 byteValue;
  vector<BitState,_std::allocator<BitState>_> polyBits;
  DataBuilder dbyte;
  
  uVar8 = (ulong)crcNumber;
  local_80 = __return_storage_ptr__;
  BytesVectorToBitsVector
            (&dataBits,stream,
             (*(int *)&(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
             *(int *)&(stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start) * 8);
  BytesVectorToBitsVector(&polyBits,genPoly,crcNumber + 1);
  uVar4 = ((int)((ulong)((long)dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2) -
          (int)((ulong)((long)polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2)) + 1;
  __n = 0;
  while ((uint)__n < uVar4) {
    bVar2 = true;
    while (uVar6 = (uint)__n, bVar2) {
      pvVar3 = std::vector<BitState,_std::allocator<BitState>_>::at(&dataBits,__n);
      bVar2 = uVar6 < uVar4 && *pvVar3 == BIT_LOW;
      __n = (size_type)(bVar2 + uVar6);
    }
    if (uVar6 < uVar4) {
      for (uVar5 = 0;
          (ulong)uVar5 <
          (ulong)((long)polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
        pvVar3 = std::vector<BitState,_std::allocator<BitState>_>::at
                           (&dataBits,(ulong)(uVar6 + uVar5));
        vVar1 = *pvVar3;
        pvVar3 = std::vector<BitState,_std::allocator<BitState>_>::at(&polyBits,(ulong)uVar5);
        dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6 + uVar5] = vVar1 ^ *pvVar3;
      }
    }
    __n = (size_type)(uVar6 + 1);
  }
  (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_80->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar4 = 0; uVar4 != crcNumber >> 3; uVar4 = uVar4 + 1) {
    byteValue = 0;
    DataBuilder::DataBuilder(&dbyte);
    DataBuilder::Reset((ulonglong *)&dbyte,(ShiftOrder)&byteValue,0);
    iVar7 = (int)(uVar8 & 0xff);
    for (uVar6 = (int)((ulong)((long)dataBits.
                                     super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2) - iVar7;
        (ulong)uVar6 <
        (((long)dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) - (uVar8 & 0xff)) + 8; uVar6 = uVar6 + 1) {
      std::vector<BitState,_std::allocator<BitState>_>::at(&dataBits,(ulong)uVar6);
      DataBuilder::AddBit((BitState)&dbyte);
    }
    local_81 = (uchar)byteValue;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (local_80,&local_81);
    uVar8 = (ulong)(iVar7 - 8);
    DataBuilder::~DataBuilder(&dbyte);
  }
  std::_Vector_base<BitState,_std::allocator<BitState>_>::~_Vector_base
            (&polyBits.super__Vector_base<BitState,_std::allocator<BitState>_>);
  std::_Vector_base<BitState,_std::allocator<BitState>_>::~_Vector_base
            (&dataBits.super__Vector_base<BitState,_std::allocator<BitState>_>);
  return local_80;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::CrcDivision( const vector<U8>& stream, const vector<U8>& genPoly, U32 crcNumber )
{
    vector<BitState> dataBits = BytesVectorToBitsVector( stream, stream.size() * 8 );
    vector<BitState> polyBits = BytesVectorToBitsVector( genPoly, crcNumber + 1 );

    U32 dataIndex = 0;
    U32 dataLimit = dataBits.size() - ( polyBits.size() - 1 );
    while( dataIndex < dataLimit )
    {
        // Advance one-position or 0-bits
        bool zeroBits = true;
        while( zeroBits )
        {
            zeroBits = ( ( dataBits.at( dataIndex ) == BIT_LOW ) && ( dataIndex < dataLimit ) );
            if( zeroBits )
            {
                dataIndex++;
            }
        }

        if( dataIndex < dataLimit )
        {
            for( U32 bitIndex = 0; bitIndex < polyBits.size(); ++bitIndex )
            {
                BitState bit = dataBits.at( dataIndex + bitIndex );
                BitState polyBit = polyBits.at( bitIndex );

                dataBits[ dataIndex + bitIndex ] = BitState( bit ^ polyBit );
            }
        }

        dataIndex++;
    }

    // put the crc result in the vector of bytes
    vector<U8> crcRet;
    U8 offset = crcNumber;
    for( U32 s = 0; s < crcNumber / 8; ++s )
    {
        U64 byteValue = 0;
        DataBuilder dbyte;
        dbyte.Reset( &byteValue, AnalyzerEnums::MsbFirst, 8 );
        for( U32 i = dataBits.size() - offset; i < dataBits.size() - offset + 8; ++i )
        {
            dbyte.AddBit( dataBits.at( i ) );
        }
        offset -= 8;
        crcRet.push_back( byteValue );
    }

    return crcRet;
}